

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhotonMap.cpp
# Opt level: O2

void __thiscall
PhotonMap::query(PhotonMap *this,int u,int dim,vector<int,_std::allocator<int>_> *res,Vector3 *P,
                double R)

{
  Ray *pRVar1;
  pointer pPVar2;
  double *pdVar3;
  double dVar4;
  int u_local;
  double local_78;
  double local_70;
  Vector3 Pu;
  Vector3 local_48;
  
  if (u != 0) {
    pPVar2 = (this->photons).super__Vector_base<Photon,_std::allocator<Photon>_>._M_impl.
             super__Vector_impl_data._M_start;
    Pu.z = pPVar2[u].ray.O.z;
    pRVar1 = &pPVar2[u].ray;
    Pu.x = (pRVar1->O).x;
    Pu.y = (pRVar1->O).y;
    u_local = u;
    local_78 = R;
    operator-(&Pu,P);
    dVar4 = Vector3::len2(&local_48);
    if (dVar4 <= local_78 * local_78) {
      std::vector<int,_std::allocator<int>_>::push_back(res,&u_local);
    }
    pdVar3 = Vector3::operator[](&Pu,dim);
    local_70 = *pdVar3;
    pdVar3 = Vector3::operator[](P,dim);
    if (local_70 - *pdVar3 <= local_78) {
      query(this,(this->nodes).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
                 super__Vector_impl_data._M_start[u_local].r,(dim + 1) % 3,res,P,local_78);
    }
    pdVar3 = Vector3::operator[](P,dim);
    local_70 = *pdVar3;
    pdVar3 = Vector3::operator[](&Pu,dim);
    if (local_70 - *pdVar3 <= local_78) {
      query(this,(this->nodes).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
                 super__Vector_impl_data._M_start[u_local].l,(dim + 1) % 3,res,P,local_78);
    }
  }
  return;
}

Assistant:

void PhotonMap::query(int u, int dim, std::vector<int> &res, const Vector3 &P, double R) const
{
    if (!u) return;
    Vector3 Pu = photons[u].ray.O;
    double dis2 = (Pu - P).len2();
    if (dis2 <= R * R) res.push_back(u);
    if (Pu[dim] - P[dim] <= R) query(nodes[u].r, (dim + 1) % 3, res, P, R);
    if (P[dim] - Pu[dim] <= R) query(nodes[u].l, (dim + 1) % 3, res, P, R);
}